

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astMakeArrayNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t astNode;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t slotCount;
  anon_struct_16_2_87263bca gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  puStack_30 = (undefined1 *)&local_78;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  uVar1 = *(ulong *)(*arguments + 0x28);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    slotCount = 0;
  }
  local_78 = sysbvm_array_create(context,slotCount);
  if (slotCount != 0) {
    sVar2 = 0;
    do {
      uVar1 = *(ulong *)(*arguments + 0x28);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        astNode = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar2 * 8);
      }
      else {
        astNode = 0;
      }
      sStack_70 = sysbvm_interpreter_evaluateASTWithEnvironment(context,astNode,arguments[1]);
      if ((local_78 & 0xf) == 0 && local_78 != 0) {
        *(sysbvm_tuple_t *)(local_78 + 0x10 + sVar2 * 8) = sStack_70;
      }
      sVar2 = sVar2 + 1;
    } while (slotCount != sVar2);
  }
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_78;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeArrayNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeArrayNode_t **tupleNode = (sysbvm_astMakeArrayNode_t**)node;

    struct {
        sysbvm_tuple_t result;
        sysbvm_tuple_t element;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*tupleNode)->super.sourcePosition);

    size_t expressionCount = sysbvm_array_getSize((*tupleNode)->elements);
    gcFrame.result = sysbvm_array_create(context, expressionCount);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        sysbvm_tuple_t expression = sysbvm_array_at((*tupleNode)->elements, i);
        gcFrame.element = sysbvm_interpreter_evaluateASTWithEnvironment(context, expression, *environment);
        sysbvm_array_atPut(gcFrame.result, i, gcFrame.element);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}